

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall Clasp::Solver::undoLevel(Solver *this,bool sp)

{
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *this_00;
  size_type sVar1;
  reference pDVar2;
  const_reference ppCVar3;
  ConstraintDB *in_RDI;
  size_type end;
  size_type i;
  ConstraintDB *undoList;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  size_type n;
  
  bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::back
            ((pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_> *)
             &in_RDI[0x12].ebo_.size);
  Assignment::undoTrail
            ((Assignment *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (size_type)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  pDVar2 = bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::back
                     ((pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_> *)
                      &in_RDI[0x12].ebo_.size);
  if (pDVar2->undo != (ConstraintDB *)0x0) {
    pDVar2 = bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::back
                       ((pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_> *
                        )&in_RDI[0x12].ebo_.size);
    this_00 = pDVar2->undo;
    n = 0;
    sVar1 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::size
                      (this_00);
    for (; n != sVar1; n = n + 1) {
      ppCVar3 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                operator[](this_00,n);
      (*(*ppCVar3)->_vptr_Constraint[3])(*ppCVar3,in_RDI);
    }
    bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::back
              ((pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_> *)
               &in_RDI[0x12].ebo_.size);
    undoFree((Solver *)CONCAT44(n,sVar1),in_RDI);
  }
  bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::pop_back
            ((pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_> *)
             &in_RDI[0x12].ebo_.size);
  return;
}

Assistant:

void Solver::undoLevel(bool sp) {
	assert(decisionLevel() != 0 && levels_.back().trailPos != assign_.trail.size() && "Decision Level must not be empty");
	assign_.undoTrail(levels_.back().trailPos, sp);
	if (levels_.back().undo) {
		const ConstraintDB& undoList = *levels_.back().undo;
		for (ConstraintDB::size_type i = 0, end = undoList.size(); i != end; ++i) {
			undoList[i]->undoLevel(*this);
		}
		undoFree(levels_.back().undo);
	}
	levels_.pop_back();
}